

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>&&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&>
          *args_1,tuple<> *args_2)

{
  size_t c;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *ppVar1;
  size_t sVar2;
  bool bVar3;
  reference key;
  iterator local_40;
  iterator local_30;
  iterator local_20;
  
  local_20.field_1 = iter.field_1;
  local_20.ctrl_ = iter.ctrl_;
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  ppVar1 = (args_1->
           super__Tuple_impl<0UL,_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&>
           ).
           super__Head_base<0UL,_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&,_false>
           ._M_head_impl;
  *(char **)((long)local_20.field_1.slot_ + 0x10) = (ppVar1->second)._M_str;
  sVar2 = (ppVar1->second)._M_len;
  *(void **)local_20.field_1.slot_ = ppVar1->first;
  *(size_t *)((long)local_20.field_1.slot_ + 8) = sVar2;
  *(undefined8 *)((long)local_20.field_1.slot_ + 0x18) = 0;
  CommonFields::set_capacity((CommonFields *)this,c);
  key = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
        ::iterator::operator*(&local_20);
  local_30 = find<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
                       (this,&key->first);
  local_40.ctrl_ = local_20.ctrl_;
  local_40.field_1.slot_ = (slot_type *)local_20.field_1;
  bVar3 = container_internal::operator==(&local_30,&local_40);
  if (bVar3) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, Args = <const std::piecewise_construct_t &, std::tuple<std::pair<const void *, std::basic_string_view<char>> &&>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }